

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

Context * Rml::GetContext(String *name)

{
  CoreData *pCVar1;
  Context *pCVar2;
  iterator iVar3;
  
  pCVar1 = ControlledLifetimeResource<Rml::CoreData>::operator->
                     ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  iVar3 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&pCVar1->contexts,name);
  pCVar1 = ControlledLifetimeResource<Rml::CoreData>::operator->
                     ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  if (iVar3.mKeyVals == (NodePtr)(pCVar1->contexts).mInfo) {
    pCVar2 = (Context *)0x0;
  }
  else {
    pCVar2 = ((iVar3.mKeyVals)->mData).second._M_t.
             super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
             super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
             super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl;
  }
  return pCVar2;
}

Assistant:

Context* GetContext(const String& name)
{
	auto it = core_data->contexts.find(name);
	if (it == core_data->contexts.end())
		return nullptr;

	return it->second.get();
}